

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test::TestBody
          (SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test *this)

{
  bool bVar1;
  WrapperMock *this_00;
  MockSpec<int_(SDL_Event_&)> *this_01;
  TypedExpectation<int_(SDL_Event_&)> *this_02;
  MouseLeftButtonDown *lhs;
  char *message;
  SDLEventsSource *this_03;
  AssertHelper local_c8;
  Message local_c0;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_b8;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  MouseLeftButtonDown mouseLeftButtonDown;
  Action<int_(SDL_Event_&)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<SDL_Event_&> local_48;
  MockSpec<int_(SDL_Event_&)> local_30;
  SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test *local_10;
  SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test *this_local;
  
  local_10 = this;
  this_00 = mock_ptr<solitaire::SDL::WrapperMock>::operator*
                      (&(this->super_SDLEventsSourceTests).sdlMock);
  testing::Matcher<SDL_Event&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<SDL_Event&> *)&local_48,(AnythingMatcher *)&testing::_);
  SDL::WrapperMock::gmock_pollEvent(&local_30,this_00,&local_48);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<int_(SDL_Event_&)>::operator()
                      (&local_30,local_55,(void *)0x0);
  this_02 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                       ,0x3f,"*sdlMock","pollEvent(_)");
  testing::
  Invoke<solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test::TestBody()::__0>
            ((type *)((long)&mouseLeftButtonDown.position.y + 2));
  testing::Action<int(SDL_Event&)>::
  Action<solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test::TestBody()::__0,void>
            ((Action<int(SDL_Event&)> *)&local_78,
             (type *)((long)&mouseLeftButtonDown.position.y + 3));
  this_03 = (SDLEventsSource *)&local_78;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (this_02,(Action<int_(SDL_Event_&)> *)this_03);
  testing::Action<int_(SDL_Event_&)>::~Action(&local_78);
  testing::internal::MockSpec<int_(SDL_Event_&)>::~MockSpec(&local_30);
  testing::Matcher<SDL_Event_&>::~Matcher(&local_48);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x7800000064;
  local_b8 = (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              )SDLEventsSource::getEvent
                         ((Event *)&(this->super_SDLEventsSourceTests).eventsSource,this_03);
  local_a8[0] = local_b8;
  lhs = std::
        get<solitaire::events::MouseLeftButtonDown,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                  ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                    *)local_a8);
  testing::internal::EqHelper::
  Compare<solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonDown,_nullptr>
            ((EqHelper *)local_98,"std::get<MouseLeftButtonDown>(eventsSource.getEvent())",
             "mouseLeftButtonDown",lhs,(MouseLeftButtonDown *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseLeftButtonDownEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_LEFT;
        event.button.x = x;
        event.button.y = y;
        return 1;
    }));

    MouseLeftButtonDown mouseLeftButtonDown {x, y};
    EXPECT_EQ(std::get<MouseLeftButtonDown>(eventsSource.getEvent()), mouseLeftButtonDown);
}